

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O1

Abc_Cex_t * Fra_SmlCopyCounterExample(Aig_Man_t *pAig,Aig_Man_t *pFrames,int *pModel)

{
  ulong uVar1;
  Abc_Cex_t *p;
  long lVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int nRealPis;
  int iVar6;
  int iVar7;
  
  iVar3 = pAig->nRegs;
  if (iVar3 < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x463,"Abc_Cex_t *Fra_SmlCopyCounterExample(Aig_Man_t *, Aig_Man_t *, int *)");
  }
  if (pFrames->nRegs != 0) {
    __assert_fail("Aig_ManRegNum(pFrames) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x464,"Abc_Cex_t *Fra_SmlCopyCounterExample(Aig_Man_t *, Aig_Man_t *, int *)");
  }
  nRealPis = pAig->nObjs[2] - iVar3;
  iVar7 = pFrames->nObjs[2];
  if ((iVar7 / nRealPis) * nRealPis != iVar7) {
    __assert_fail("nTruePis * nFrames == Aig_ManCiNum(pFrames)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x468,"Abc_Cex_t *Fra_SmlCopyCounterExample(Aig_Man_t *, Aig_Man_t *, int *)");
  }
  iVar6 = pAig->nObjs[3] - iVar3;
  if ((iVar7 / nRealPis) * iVar6 != pFrames->nObjs[3]) {
    __assert_fail("nTruePos * nFrames == Aig_ManCoNum(pFrames)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x469,"Abc_Cex_t *Fra_SmlCopyCounterExample(Aig_Man_t *, Aig_Man_t *, int *)");
  }
  uVar4 = (ulong)pFrames->vCos->nSize;
  iVar5 = -1;
  if (0 < (long)uVar4) {
    uVar1 = 0;
    do {
      if (*(int *)((long)pFrames->vCos->pArray[uVar1] + 0x24) == pModel[iVar7]) {
        uVar4 = (ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff;
        iVar5 = (int)((long)uVar4 % (long)iVar6);
        iVar7 = (int)((long)uVar4 / (long)iVar6);
        goto LAB_0069902e;
      }
      uVar1 = uVar1 + 1;
    } while (uVar4 != uVar1);
  }
  iVar7 = -1;
LAB_0069902e:
  if (-1 < iVar5) {
    p = Abc_CexAlloc(iVar3,nRealPis,iVar7 + 1);
    p->iPo = iVar5;
    p->iFrame = iVar7;
    if (0 < pFrames->nObjs[2]) {
      lVar2 = 0;
      do {
        if (pModel[lVar2] != 0) {
          iVar3 = p->nRegs + (int)lVar2;
          (&p[1].iPo)[iVar3 >> 5] = (&p[1].iPo)[iVar3 >> 5] | 1 << ((byte)iVar3 & 0x1f);
        }
      } while ((p->nRegs + (int)lVar2 != p->nBits + -1) &&
              (lVar2 = lVar2 + 1, lVar2 < pFrames->nObjs[2]));
    }
    iVar3 = Saig_ManVerifyCex(pAig,p);
    if (iVar3 == 0) {
      puts("Fra_SmlGetCounterExample(): Counter-example is invalid.");
      Abc_CexFree(p);
      p = (Abc_Cex_t *)0x0;
    }
    return p;
  }
  __assert_fail("iPo >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                ,0x474,"Abc_Cex_t *Fra_SmlCopyCounterExample(Aig_Man_t *, Aig_Man_t *, int *)");
}

Assistant:

Abc_Cex_t * Fra_SmlCopyCounterExample( Aig_Man_t * pAig, Aig_Man_t * pFrames, int * pModel )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    int i, nFrames, nTruePis, nTruePos, iPo, iFrame;
    // get the number of frames
    assert( Aig_ManRegNum(pAig) > 0 );
    assert( Aig_ManRegNum(pFrames) == 0 );
    nTruePis = Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig);
    nTruePos = Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig);
    nFrames = Aig_ManCiNum(pFrames) / nTruePis;
    assert( nTruePis * nFrames == Aig_ManCiNum(pFrames) );
    assert( nTruePos * nFrames == Aig_ManCoNum(pFrames) );
    // find the PO that failed
    iPo = -1;
    iFrame = -1;
    Aig_ManForEachCo( pFrames, pObj, i )
        if ( pObj->Id == pModel[Aig_ManCiNum(pFrames)] )
        {
            iPo = i % nTruePos;
            iFrame = i / nTruePos;
            break;
        }
    assert( iPo >= 0 );
    // allocate the counter example
    pCex = Abc_CexAlloc( Aig_ManRegNum(pAig), nTruePis, iFrame + 1 );
    pCex->iPo    = iPo;
    pCex->iFrame = iFrame;

    // copy the bit data
    for ( i = 0; i < Aig_ManCiNum(pFrames); i++ )
    {
        if ( pModel[i] )
            Abc_InfoSetBit( pCex->pData, pCex->nRegs + i );
        if ( pCex->nRegs + i == pCex->nBits - 1 )
            break;
    }

    // verify the counter example
    if ( !Saig_ManVerifyCex( pAig, pCex ) )
    {
        printf( "Fra_SmlGetCounterExample(): Counter-example is invalid.\n" );
        Abc_CexFree( pCex );
        pCex = NULL;
    }
    return pCex;

}